

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cc
# Opt level: O2

Object * __thiscall xt::Object::operator=(Object *this,Object *o)

{
  Type TVar1;
  
  TVar1 = o->type;
  this->type = TVar1;
  switch(TVar1) {
  case Boolean:
  case Char:
    (this->field_2).b = (o->field_2).b;
    break;
  case Number:
    (this->field_2).number = (o->field_2).number;
    break;
  case Pointer:
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&(this->field_2).ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
               &(o->field_2).ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  }
  this->typeinfo = o->typeinfo;
  return this;
}

Assistant:

Object& Object::operator=(const Object& o) {
	type = o.type;
	if (type == Type::Boolean) b = o.b;
	if (type == Type::Number) number = o.number;
	if (type == Type::Char) ch = o.ch;
	if (type == Type::Pointer) new (&ptr) std::shared_ptr<void>(o.ptr);
	typeinfo = o.typeinfo;
	return *this;
}